

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_FilterVoice
               (FAudio *audio,FAudioFilterParameters *filter,FAudioFilterState *filterState,
               float *samples,uint32_t numSamples,uint16_t numChannels)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  FAudioFilterParameters *pFVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  uVar5 = 0;
  for (iVar6 = 0; pFVar4 = filter, uVar7 = (ulong)numSamples, uVar3 = uVar5, iVar6 != (int)samples;
      iVar6 = iVar6 + 1) {
    while( true ) {
      if (uVar7 == 0) break;
      fVar1 = pFVar4->Frequency;
      fVar8 = (float)audio->refcount * fVar1 + (float)pFVar4->Type;
      pFVar4->Type = (FAudioFilterType)fVar8;
      fVar9 = ((*filterState)[uVar3] - fVar8) - (float)audio->initFlags * fVar1;
      pFVar4->OneOverQ = fVar9;
      pFVar4->Frequency = fVar9 * (float)audio->refcount + fVar1;
      pFVar4[1].Type = (FAudioFilterType)(fVar8 + fVar9);
      uVar2._0_1_ = audio->version;
      uVar2._1_1_ = audio->active;
      uVar2._2_2_ = *(undefined2 *)&audio->field_0x2;
      (*filterState)[uVar3] = (float)(&pFVar4->Type)[uVar2];
      pFVar4 = (FAudioFilterParameters *)&pFVar4[1].Frequency;
      uVar7 = uVar7 - 1;
      uVar3 = uVar3 + 1;
    }
    uVar5 = uVar5 + numSamples;
  }
  return;
}

Assistant:

static inline void FAudio_INTERNAL_FilterVoice(
	FAudio *audio,
	const FAudioFilterParameters *filter,
	FAudioFilterState *filterState,
	float *samples,
	uint32_t numSamples,
	uint16_t numChannels
) {
	uint32_t j, ci;

	LOG_FUNC_ENTER(audio)

	/* Apply a digital state-variable filter to the voice.
	 * The difference equations of the filter are:
	 *
	 * Yl(n) = F Yb(n - 1) + Yl(n - 1)
	 * Yh(n) = x(n) - Yl(n) - OneOverQ Yb(n - 1)
	 * Yb(n) = F Yh(n) + Yb(n - 1)
	 * Yn(n) = Yl(n) + Yh(n)
	 *
	 * Please note that FAudioFilterParameters.Frequency is defined as:
	 *
	 * (2 * sin(pi * (desired filter cutoff frequency) / sampleRate))
	 *
	 * - @JohanSmet
	 */

	for (j = 0; j < numSamples; j += 1)
	for (ci = 0; ci < numChannels; ci += 1)
	{
		filterState[ci][FAudioLowPassFilter] = filterState[ci][FAudioLowPassFilter] + (filter->Frequency * filterState[ci][FAudioBandPassFilter]);
		filterState[ci][FAudioHighPassFilter] = samples[j * numChannels + ci] - filterState[ci][FAudioLowPassFilter] - (filter->OneOverQ * filterState[ci][FAudioBandPassFilter]);
		filterState[ci][FAudioBandPassFilter] = (filter->Frequency * filterState[ci][FAudioHighPassFilter]) + filterState[ci][FAudioBandPassFilter];
		filterState[ci][FAudioNotchFilter] = filterState[ci][FAudioHighPassFilter] + filterState[ci][FAudioLowPassFilter];
		samples[j * numChannels + ci] = filterState[ci][filter->Type];
	}

	LOG_FUNC_EXIT(audio)
}